

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore(player_shape *s)

{
  textblock *tb_00;
  textblock *tb;
  player_shape *s_local;
  
  tb_00 = textblock_new();
  textblock_append(tb_00,"%s",s->name);
  textblock_append(tb_00,
                   "\nLike all shapes, the equipment at the time of the shapechange sets the base attributes, including damage per blow, number of blows and resistances.  While changed, items in your pack or on the floor (except for pickup or eating) are inaccessible.  To switch back to your normal shape, cast a spell or use an item command other than eat (drop, for instance).\n"
                  );
  shape_lore_append_basic_combat(tb_00,s);
  shape_lore_append_skills(tb_00,s);
  shape_lore_append_non_stat_modifiers(tb_00,s);
  shape_lore_append_stat_modifiers(tb_00,s);
  shape_lore_append_resistances(tb_00,s);
  shape_lore_append_protection_flags(tb_00,s);
  shape_lore_append_sustains(tb_00,s);
  shape_lore_append_misc_flags(tb_00,s);
  shape_lore_append_change_effects(tb_00,s);
  shape_lore_append_triggering_spells(tb_00,s);
  textui_textblock_show(tb_00,(region_conflict)ZEXT816((ulong)0),(char *)0x0);
  textblock_free(tb_00);
  return;
}

Assistant:

static void shape_lore(const struct player_shape *s)
{
	textblock *tb = textblock_new();

	textblock_append(tb, "%s", s->name);
	textblock_append(tb, "\nLike all shapes, the equipment at the time of "
		"the shapechange sets the base attributes, including damage "
		"per blow, number of blows and resistances.  While changed, "
		"items in your pack or on the floor (except for pickup or "
		"eating) are inaccessible.  To switch back to your normal "
		"shape, cast a spell or use an item command other than eat "
		"(drop, for instance).\n");
	shape_lore_append_basic_combat(tb, s);
	shape_lore_append_skills(tb, s);
	shape_lore_append_non_stat_modifiers(tb, s);
	shape_lore_append_stat_modifiers(tb, s);
	shape_lore_append_resistances(tb, s);
	shape_lore_append_protection_flags(tb, s);
	shape_lore_append_sustains(tb, s);
	shape_lore_append_misc_flags(tb, s);
	shape_lore_append_change_effects(tb, s);
	shape_lore_append_triggering_spells(tb, s);

	textui_textblock_show(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}